

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O0

sat_solver * Pdr_ManNewSolver(sat_solver *pSat,Pdr_Man_t *p,int k,int fInit)

{
  int fInit_local;
  int k_local;
  Pdr_Man_t *p_local;
  sat_solver *pSat_local;
  
  if (pSat != (sat_solver *)0x0) {
    if (p->pPars->fMonoCnf == 0) {
      pSat_local = Pdr_ManNewSolver2(pSat,p,k,fInit);
    }
    else {
      pSat_local = Pdr_ManNewSolver1(pSat,p,k,fInit);
    }
    return pSat_local;
  }
  __assert_fail("pSat != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                ,0x1b9,"sat_solver *Pdr_ManNewSolver(sat_solver *, Pdr_Man_t *, int, int)");
}

Assistant:

sat_solver * Pdr_ManNewSolver( sat_solver * pSat, Pdr_Man_t * p, int k, int fInit )
{
    assert( pSat != NULL );
    if ( p->pPars->fMonoCnf )
        return Pdr_ManNewSolver1( pSat, p, k, fInit );
    else
        return Pdr_ManNewSolver2( pSat, p, k, fInit );
}